

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

int jas_stream_display(jas_stream_t *stream,FILE *fp,int n)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  int cnt;
  int display;
  int c;
  int m;
  int j;
  int i;
  uchar buf [16];
  int n_local;
  FILE *fp_local;
  jas_stream_t *stream_local;
  
  bVar2 = true;
  m = 0;
  do {
    if (n <= m) {
      return 0;
    }
    if ((0x10 < n) && (0 < m)) {
      bVar2 = n - n % 0x10 <= m;
    }
    if (bVar2) {
      fprintf((FILE *)fp,"%08x:",(ulong)(uint)m);
    }
    if (n - m < 0x10) {
      local_58 = n - m;
    }
    else {
      local_58 = 0x10;
    }
    for (c = 0; c < local_58; c = c + 1) {
      if ((stream->flags_ & 7U) == 0) {
        if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
          iVar3 = stream->cnt_ + -1;
          stream->cnt_ = iVar3;
          if (iVar3 < 0) {
            local_60 = jas_stream_fillbuf(stream,1);
          }
          else {
            stream->rwcnt_ = stream->rwcnt_ + 1;
            pbVar1 = stream->ptr_;
            stream->ptr_ = pbVar1 + 1;
            local_60 = (uint)*pbVar1;
          }
          local_5c = local_60;
        }
        else {
          stream->flags_ = stream->flags_ | 4;
          local_5c = 0xffffffff;
        }
        local_64 = local_5c;
      }
      else {
        local_64 = 0xffffffff;
      }
      if (local_64 == 0xffffffff) {
        abort();
      }
      *(char *)((long)&j + (long)c) = (char)local_64;
    }
    if (bVar2) {
      for (c = 0; c < local_58; c = c + 1) {
        fprintf((FILE *)fp," %02x",(ulong)*(byte *)((long)&j + (long)c));
      }
      fputc(0x20,(FILE *)fp);
      for (; c < 0x10; c = c + 1) {
        fprintf((FILE *)fp,"   ");
      }
      for (c = 0; c < local_58; c = c + 1) {
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[(int)(uint)*(byte *)((long)&j + (long)c)] & 0x4000) == 0) {
          fputc(0x20,(FILE *)fp);
        }
        else {
          fputc((uint)*(byte *)((long)&j + (long)c),(FILE *)fp);
        }
      }
      fprintf((FILE *)fp,"\n");
    }
    m = m + 0x10;
  } while( true );
}

Assistant:

int jas_stream_display(jas_stream_t *stream, FILE *fp, int n)
{
	unsigned char buf[16];
	int i;
	int j;
	int m;
	int c;
	int display;
	int cnt;

	cnt = n - (n % 16);
	display = 1;

	for (i = 0; i < n; i += 16) {
		if (n > 16 && i > 0) {
			display = (i >= cnt) ? 1 : 0;
		}
		if (display) {
			fprintf(fp, "%08x:", i);
		}
		m = JAS_MIN(n - i, 16);
		for (j = 0; j < m; ++j) {
			if ((c = jas_stream_getc(stream)) == EOF) {
				abort();
				return -1;
			}
			buf[j] = c;
		}
		if (display) {
			for (j = 0; j < m; ++j) {
				fprintf(fp, " %02x", buf[j]);
			}
			fputc(' ', fp);
			for (; j < 16; ++j) {
				fprintf(fp, "   ");
			}
			for (j = 0; j < m; ++j) {
				if (isprint(buf[j])) {
					fputc(buf[j], fp);
				} else {
					fputc(' ', fp);
				}
			}
			fprintf(fp, "\n");
		}


	}
	return 0;
}